

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strrchr32_63(UChar *s,UChar32 c)

{
  UChar *pUVar1;
  UChar *pUVar2;
  
  if (0xffff < (uint)c) {
    if ((uint)c < 0x110000) {
      pUVar1 = (UChar *)0x0;
      while (pUVar2 = s, *pUVar2 != L'\0') {
        s = pUVar2 + 1;
        if ((((uint)c >> 10) + 0xd7c0 == (uint)(ushort)*pUVar2) &&
           ((c & 0x3ffU | 0xdc00) == (uint)(ushort)*s)) {
          pUVar1 = pUVar2;
        }
      }
    }
    else {
      pUVar1 = (UChar *)0x0;
    }
    return pUVar1;
  }
  pUVar1 = u_strrchr_63(s,(UChar)c);
  return pUVar1;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strrchr32(const UChar *s, UChar32 c) {
    if((uint32_t)c<=U_BMP_MAX) {
        /* find BMP code point */
        return u_strrchr(s, (UChar)c);
    } else if((uint32_t)c<=UCHAR_MAX_VALUE) {
        /* find supplementary code point as surrogate pair */
        const UChar *result=NULL;
        UChar cs, lead=U16_LEAD(c), trail=U16_TRAIL(c);

        while((cs=*s++)!=0) {
            if(cs==lead && *s==trail) {
                result=s-1;
            }
        }
        return (UChar *)result;
    } else {
        /* not a Unicode code point, not findable */
        return NULL;
    }
}